

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

int Rtm_ManMarkAutoBwd(Rtm_Man_t *pRtm)

{
  void *pvVar1;
  Rtm_Obj_t *pObj;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  pvVar1 = Vec_PtrEntry(pRtm->vObjs,0);
  *(byte *)((long)pvVar1 + 8) = *(byte *)((long)pvVar1 + 8) | 0x10;
  for (iVar3 = 0; iVar3 < pRtm->vPis->nSize; iVar3 = iVar3 + 1) {
    pvVar1 = Vec_PtrEntry(pRtm->vPis,iVar3);
    *(byte *)((long)pvVar1 + 8) = *(byte *)((long)pvVar1 + 8) | 0x10;
  }
  for (iVar3 = 0; iVar3 < pRtm->vPos->nSize; iVar3 = iVar3 + 1) {
    pObj = (Rtm_Obj_t *)Vec_PtrEntry(pRtm->vPos,iVar3);
    Rtm_ObjMarkAutoBwd_rec(pObj);
  }
  iVar4 = 0;
  for (iVar3 = 0; iVar3 < pRtm->vObjs->nSize; iVar3 = iVar3 + 1) {
    pvVar1 = Vec_PtrEntry(pRtm->vObjs,iVar3);
    uVar2 = *(uint *)((long)pvVar1 + 8) ^ 0x10;
    *(uint *)((long)pvVar1 + 8) = uVar2;
    iVar4 = iVar4 + (uint)((uVar2 >> 4 & 1) != 0);
  }
  return iVar4;
}

Assistant:

int Rtm_ManMarkAutoBwd( Rtm_Man_t * pRtm )
{
    Rtm_Obj_t * pObjRtm;
    int i, Counter = 0;
    // mark nodes reachable from the PIs
    pObjRtm = (Rtm_Obj_t *)Vec_PtrEntry( pRtm->vObjs, 0 );
    pObjRtm->fAuto = 1;
    Rtm_ManForEachPi( pRtm, pObjRtm, i )
        pObjRtm->fAuto = 1;
    Rtm_ManForEachPo( pRtm, pObjRtm, i )
        Rtm_ObjMarkAutoBwd_rec( pObjRtm );
    // count the number of autonomous nodes
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    {
        pObjRtm->fAuto = !pObjRtm->fAuto;
        Counter += pObjRtm->fAuto;
    }
    // mark the fanins of the autonomous nodes
    return Counter;
}